

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_asof_join.cpp
# Opt level: O2

void __thiscall
duckdb::AsOfProbeBuffer::ResolveJoin(AsOfProbeBuffer *this,bool *found_match,idx_t *matches)

{
  unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true> *this_00;
  unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true> *this_01;
  optional_ptr<duckdb::PartitionGlobalHashGroup,_true> *this_02;
  idx_t entry_idx_p;
  idx_t iVar1;
  idx_t iVar2;
  idx_t iVar3;
  sel_t *psVar4;
  bool bVar5;
  int iVar6;
  pointer pSVar7;
  type pSVar8;
  PartitionGlobalHashGroup *pPVar9;
  type right;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  idx_t iVar13;
  
  this->lhs_match_count = 0;
  if ((this->right_itr).
      super_unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>._M_t.
      super___uniq_ptr_impl<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::SBIterator_*,_std::default_delete<duckdb::SBIterator>_>.
      super__Head_base<0UL,_duckdb::SBIterator_*,_false>._M_head_impl != (SBIterator *)0x0) {
    this_00 = &this->right_itr;
    iVar1 = (this->lhs_payload).count;
    this_01 = &this->left_itr;
    pSVar7 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
             operator->(this_01);
    iVar2 = pSVar7->entry_idx;
    this_02 = &this->right_hash;
    for (iVar13 = 0; iVar13 != iVar1; iVar13 = iVar13 + 1) {
      pSVar7 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
               operator->(this_01);
      SBIterator::SetIndex(pSVar7,iVar13 + iVar2);
      pSVar7 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
               operator->(this_00);
      pSVar8 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
               operator*(this_01);
      bVar5 = SBIterator::Compare(pSVar7,pSVar8);
      if (bVar5) {
        pSVar7 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
                 operator->(this_00);
        iVar3 = pSVar7->entry_idx;
        pSVar7 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
                 operator->(this_00);
        SBIterator::SetIndex(pSVar7,iVar3 + 1);
        uVar11 = 1;
        while( true ) {
          pSVar7 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
                   operator->(this_00);
          uVar10 = pSVar7->entry_idx;
          pPVar9 = optional_ptr<duckdb::PartitionGlobalHashGroup,_true>::operator->(this_02);
          if ((pPVar9->count).super___atomic_base<unsigned_long>._M_i <= uVar10) break;
          pSVar7 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
                   operator->(this_00);
          pSVar8 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
                   operator*(this_01);
          bVar5 = SBIterator::Compare(pSVar7,pSVar8);
          if (!bVar5) break;
          pSVar7 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
                   operator->(this_00);
          SBIterator::SetIndex(pSVar7,iVar3 + uVar11 * 2);
          uVar11 = uVar11 * 2;
        }
        uVar12 = (uVar11 >> 1) + iVar3;
        pPVar9 = optional_ptr<duckdb::PartitionGlobalHashGroup,_true>::operator->(this_02);
        uVar10 = (pPVar9->count).super___atomic_base<unsigned_long>._M_i;
        entry_idx_p = uVar11 + iVar3;
        if (uVar10 <= uVar11 + iVar3) {
          entry_idx_p = uVar10;
        }
        while (uVar11 = entry_idx_p, uVar12 <= uVar11 && uVar11 - uVar12 != 0) {
          uVar10 = uVar11 - uVar12 >> 1;
          entry_idx_p = uVar12 + uVar10;
          pSVar7 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
                   operator->(this_00);
          SBIterator::SetIndex(pSVar7,entry_idx_p);
          pSVar7 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
                   operator->(this_00);
          pSVar8 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
                   operator*(this_01);
          bVar5 = SBIterator::Compare(pSVar7,pSVar8);
          if (bVar5) {
            uVar12 = uVar12 + uVar10 + 1;
            entry_idx_p = uVar11;
          }
        }
        pSVar7 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
                 operator->(this_00);
        SBIterator::SetIndex(pSVar7,uVar12 - 1);
        pPVar9 = optional_ptr<duckdb::PartitionGlobalHashGroup,_true>::operator->(this_02);
        pSVar8 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
                 operator*(this_01);
        right = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
                operator*(this_00);
        iVar6 = PartitionGlobalHashGroup::ComparePartitions(pPVar9,pSVar8,right);
        if (iVar6 == 0) {
          if (found_match != (bool *)0x0) {
            found_match[iVar13] = true;
          }
          if (matches != (idx_t *)0x0) {
            matches[iVar13] = uVar12 - 1;
          }
          psVar4 = (this->lhs_sel).sel_vector;
          iVar3 = this->lhs_match_count;
          this->lhs_match_count = iVar3 + 1;
          psVar4[iVar3] = (sel_t)iVar13;
        }
      }
    }
  }
  return;
}

Assistant:

void AsOfProbeBuffer::ResolveJoin(bool *found_match, idx_t *matches) {
	// If there was no right partition, there are no matches
	lhs_match_count = 0;
	if (!right_itr) {
		return;
	}

	const auto count = lhs_payload.size();
	const auto left_base = left_itr->GetIndex();
	//	Searching for right <= left
	for (idx_t i = 0; i < count; ++i) {
		left_itr->SetIndex(left_base + i);

		//	If right > left, then there is no match
		if (!right_itr->Compare(*left_itr)) {
			continue;
		}

		// Exponential search forward for a non-matching value using radix iterators
		// (We use exponential search to avoid thrashing the block manager on large probes)
		idx_t bound = 1;
		idx_t begin = right_itr->GetIndex();
		right_itr->SetIndex(begin + bound);
		while (right_itr->GetIndex() < right_hash->count) {
			if (right_itr->Compare(*left_itr)) {
				//	If right <= left, jump ahead
				bound *= 2;
				right_itr->SetIndex(begin + bound);
			} else {
				break;
			}
		}

		//	Binary search for the first non-matching value using radix iterators
		//	The previous value (which we know exists) is the match
		auto first = begin + bound / 2;
		auto last = MinValue<idx_t>(begin + bound, right_hash->count);
		while (first < last) {
			const auto mid = first + (last - first) / 2;
			right_itr->SetIndex(mid);
			if (right_itr->Compare(*left_itr)) {
				//	If right <= left, new lower bound
				first = mid + 1;
			} else {
				last = mid;
			}
		}
		right_itr->SetIndex(--first);

		//	Check partitions for strict equality
		if (right_hash->ComparePartitions(*left_itr, *right_itr)) {
			continue;
		}

		// Emit match data
		if (found_match) {
			found_match[i] = true;
		}
		if (matches) {
			matches[i] = first;
		}
		lhs_sel.set_index(lhs_match_count++, i);
	}
}